

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-stb-image.h
# Opt level: O3

int stbi__psd_decode_rle(stbi__context *s,stbi_uc *p,int pixelCount)

{
  byte bVar1;
  stbi_uc sVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  
  if (0 < pixelCount) {
    iVar4 = 0;
    uVar3 = pixelCount;
    do {
      bVar1 = stbi__get8(s);
      if (bVar1 != 0x80) {
        uVar5 = (uint)bVar1;
        if ((char)bVar1 < '\0') {
          uVar6 = 0x101 - uVar5;
          if (uVar3 < uVar6) {
            return 0;
          }
          sVar2 = stbi__get8(s);
          iVar7 = uVar5 - 0x101;
          do {
            *p = sVar2;
            p = p + 4;
            iVar7 = iVar7 + 1;
          } while (iVar7 != 0);
        }
        else {
          if (uVar3 <= bVar1) {
            return 0;
          }
          uVar6 = uVar5 + 1;
          uVar3 = uVar6;
          do {
            sVar2 = stbi__get8(s);
            *p = sVar2;
            p = p + 4;
            uVar3 = uVar3 - 1;
          } while (uVar3 != 0);
        }
        iVar4 = iVar4 + uVar6;
      }
      uVar3 = pixelCount - iVar4;
    } while (uVar3 != 0 && iVar4 <= pixelCount);
  }
  return 1;
}

Assistant:

static int stbi__psd_decode_rle(stbi__context *s, stbi_uc *p, int pixelCount)
{
   int count, nleft, len;

   count = 0;
   while ((nleft = pixelCount - count) > 0) {
      len = stbi__get8(s);
      if (len == 128) {
         // No-op.
      } else if (len < 128) {
         // Copy next len+1 bytes literally.
         len++;
         if (len > nleft) return 0; // corrupt data
         count += len;
         while (len) {
            *p = stbi__get8(s);
            p += 4;
            len--;
         }
      } else if (len > 128) {
         stbi_uc   val;
         // Next -len+1 bytes in the dest are replicated from next source byte.
         // (Interpret len as a negative 8-bit int.)
         len = 257 - len;
         if (len > nleft) return 0; // corrupt data
         val = stbi__get8(s);
         count += len;
         while (len) {
            *p = val;
            p += 4;
            len--;
         }
      }
   }

   return 1;
}